

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.c
# Opt level: O0

unsigned_long ellapsed_time(void)

{
  undefined1 local_20 [8];
  timeval now;
  
  if ((ellapsed_time::ref.tv_sec == 0) && (ellapsed_time::ref.tv_usec == 0)) {
    gettimeofday((timeval *)&ellapsed_time::ref,(__timezone_ptr_t)0x0);
    now.tv_usec = 0;
  }
  else {
    gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
    now.tv_usec = ((long)local_20 - ellapsed_time::ref.tv_sec) * 1000 +
                  (now.tv_sec - ellapsed_time::ref.tv_usec) / 1000;
  }
  return now.tv_usec;
}

Assistant:

static unsigned long ellapsed_time( void )
{
#if defined(_WIN32)
    return( 0 );
#else
    static struct timeval ref = { 0, 0 };
    struct timeval now;

    if( ref.tv_sec == 0 && ref.tv_usec == 0 )
    {
        gettimeofday( &ref, NULL );
        return( 0 );
    }

    gettimeofday( &now, NULL );
    return( 1000 * ( now.tv_sec  - ref.tv_sec )
                 + ( now.tv_usec - ref.tv_usec ) / 1000 );
#endif
}